

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<char>::emplace_back<char>(SmallVectorBase<char> *this,char *args)

{
  size_type sVar1;
  ulong uVar2;
  size_type sVar3;
  reference __dest;
  pointer __n;
  char *pcVar4;
  char *__src;
  reference __dest_00;
  long lVar5;
  ulong capacity;
  
  pcVar4 = this->data_ + this->len;
  if (this->len != this->cap) {
    *pcVar4 = *args;
    sVar1 = this->len;
    sVar3 = sVar1 + 1;
    this->len = sVar3;
    if (sVar3 == 0) {
      assert::assertFailed
                ("len",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                 ,0x62,"reference slang::SmallVectorBase<char>::back() [T = char]");
    }
    return this->data_ + sVar1;
  }
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar2 = this->cap;
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar5 = (long)pcVar4 - (long)this->data_;
  __dest = (reference)detail::allocArray(capacity,1);
  __dest[lVar5] = *args;
  __src = this->data_;
  __n = (pointer)this->len;
  if (__src + (long)__n == pcVar4) {
    __dest_00 = __dest;
    if (__n == (pointer)0x0) goto LAB_00160d5c;
  }
  else {
    if (__src != pcVar4) {
      memmove(__dest,__src,(long)pcVar4 - (long)__src);
    }
    __n = this->data_ + (this->len - (long)pcVar4);
    if (__n == (pointer)0x0) goto LAB_00160d5c;
    __src = pcVar4;
    __dest_00 = __dest + lVar5 + 1;
  }
  memmove(__dest_00,__src,(size_t)__n);
LAB_00160d5c:
  if (this->data_ != this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __dest;
  return __dest + lVar5;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }